

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.h
# Opt level: O2

int fio_str_iseq(fio_str_s *str1,fio_str_s *str2)

{
  uint uVar1;
  int iVar2;
  fio_str_info_s s2;
  fio_str_info_s s1;
  
  if (str1 == str2) {
    uVar1 = 1;
  }
  else {
    uVar1 = 0;
    if (str2 != (fio_str_s *)0x0 && str1 != (fio_str_s *)0x0) {
      fio_str_info(&s1,str1);
      fio_str_info(&s2,str2);
      uVar1 = 0;
      if (s1.len == s2.len) {
        iVar2 = bcmp(s1.data,s2.data,s1.len);
        uVar1 = (uint)(iVar2 == 0);
      }
    }
  }
  return uVar1;
}

Assistant:

inline FIO_FUNC int fio_str_iseq(const fio_str_s *str1, const fio_str_s *str2) {
  if (str1 == str2)
    return 1;
  if (!str1 || !str2)
    return 0;
  fio_str_info_s s1 = fio_str_info(str1);
  fio_str_info_s s2 = fio_str_info(str2);
  return (s1.len == s2.len && !memcmp(s1.data, s2.data, s1.len));
}